

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

bool getOrTestHomeDirectory(cmState *state,string *value,string *errorMessage)

{
  undefined8 errorMessage_00;
  char *__s;
  ulong uVar1;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string valueCML;
  string cachedValueCML;
  undefined1 local_a8 [8];
  string suffix;
  allocator<char> local_7d [20];
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string cachedValue;
  string *errorMessage_local;
  string *value_local;
  cmState *state_local;
  
  cachedValue.field_2._8_8_ = errorMessage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_HOME_DIRECTORY",&local_69);
  __s = cmState::GetCacheEntryValue(state,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,local_7d);
  std::allocator<char>::~allocator(local_7d);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"/CMakeLists.txt",
               (allocator<char> *)(cachedValueCML.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(cachedValueCML.field_2._M_local_buf + 0xf))
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&valueCML.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
    state_local._7_1_ =
         cmsys::SystemTools::SameFile((string *)local_f0,(string *)((long)&valueCML.field_2 + 8));
    errorMessage_00 = cachedValue.field_2._8_8_;
    if (!state_local._7_1_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "\"CMAKE_HOME_DIRECTORY\" is set but incompatible with configured source directory value."
                 ,&local_111);
      setErrorMessage((string *)errorMessage_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    suffix.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(valueCML.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    std::__cxx11::string::operator=((string *)value,(string *)local_48);
    state_local._7_1_ = true;
    suffix.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return state_local._7_1_;
}

Assistant:

static bool getOrTestHomeDirectory(cmState* state, std::string& value,
                                   std::string* errorMessage)
{
  const std::string cachedValue =
    std::string(state->GetCacheEntryValue("CMAKE_HOME_DIRECTORY"));
  if (value.empty()) {
    value = cachedValue;
    return true;
  }
  const std::string suffix = "/CMakeLists.txt";
  const std::string cachedValueCML = cachedValue + suffix;
  const std::string valueCML = value + suffix;
  if (!cmSystemTools::SameFile(valueCML, cachedValueCML)) {
    setErrorMessage(errorMessage,
                    std::string("\"CMAKE_HOME_DIRECTORY\" is set but "
                                "incompatible with configured "
                                "source directory value."));
    return false;
  }
  return true;
}